

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

Option * getOptionPred(StringRef Name,size_t *Length,_func_bool_Option_ptr *Pred,
                      StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  StringMapEntryBase **ppSVar5;
  StringMapEntryBase **ppSVar6;
  ulong uVar7;
  StringRef Key;
  
  uVar7 = Name.Length;
  iVar2 = llvm::StringMapImpl::FindKey(&OptionsMap->super_StringMapImpl,Name);
  uVar4 = (ulong)(OptionsMap->super_StringMapImpl).NumBuckets;
  uVar3 = (long)iVar2;
  if (iVar2 == -1) {
    uVar3 = uVar4;
  }
  if (uVar7 < 2 || uVar3 != uVar4) {
    ppSVar5 = (OptionsMap->super_StringMapImpl).TheTable;
    ppSVar6 = ppSVar5 + uVar3;
    ppSVar5 = ppSVar5 + uVar4;
  }
  else {
    do {
      uVar7 = uVar7 - 1;
      Key.Length = uVar7;
      Key.Data = Name.Data;
      iVar2 = llvm::StringMapImpl::FindKey(&OptionsMap->super_StringMapImpl,Key);
      uVar4 = (ulong)(OptionsMap->super_StringMapImpl).NumBuckets;
      uVar3 = (long)iVar2;
      if (iVar2 == -1) {
        uVar3 = uVar4;
      }
    } while ((uVar3 == uVar4) && (1 < uVar7));
    ppSVar6 = (OptionsMap->super_StringMapImpl).TheTable;
    ppSVar5 = ppSVar6 + uVar4;
    ppSVar6 = ppSVar6 + uVar3;
  }
  if ((ppSVar6 != ppSVar5) && (bVar1 = (*Pred)((Option *)(*ppSVar6)[1].StrLen), bVar1)) {
    *Length = uVar7;
    return (Option *)(*ppSVar6)[1].StrLen;
  }
  return (Option *)0x0;
}

Assistant:

static Option *getOptionPred(StringRef Name, size_t &Length,
                             bool (*Pred)(const Option *),
                             const StringMap<Option *> &OptionsMap) {

  StringMap<Option *>::const_iterator OMI = OptionsMap.find(Name);

  // Loop while we haven't found an option and Name still has at least two
  // characters in it (so that the next iteration will not be the empty
  // string.
  while (OMI == OptionsMap.end() && Name.size() > 1) {
    Name = Name.substr(0, Name.size() - 1); // Chop off the last character.
    OMI = OptionsMap.find(Name);
  }

  if (OMI != OptionsMap.end() && Pred(OMI->second)) {
    Length = Name.size();
    return OMI->second; // Found one!
  }
  return nullptr; // No option found!
}